

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzreducedspace.cpp
# Opt level: O1

void __thiscall
TPZReducedSpace::ShapeX(TPZReducedSpace *this,TPZVec<double> *qsi,TPZMaterialDataT<double> *data)

{
  TPZInterpolationSpace *this_00;
  int64_t newRows;
  ulong uVar1;
  ulong uVar2;
  TPZFNMatrix<30,_double> *pTVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  TPZMaterialDataT<double> inteldata;
  long local_82c0;
  long local_82b8;
  long local_8290;
  TPZMaterialDataT<double> local_8260;
  
  this_00 = this->fReferred;
  TPZMaterialDataT<double>::TPZMaterialDataT(&local_8260);
  local_8260.super_TPZMaterialData.fNeedsSol = true;
  TPZInterpolationSpace::ComputeSolution(this_00,qsi,&local_8260,false);
  TPZManVector<TPZManVector<double,_10>,_20>::operator=
            (&data->sol,(TPZManVector<TPZManVector<double,_10>,_20> *)((long)&local_8260 + 0x48d0U))
  ;
  TPZManVector<TPZFNMatrix<30,_double>,_20>::operator=
            (&data->dsol,(TPZManVector<TPZFNMatrix<30,_double>,_20> *)((long)&local_8260 + 0x51b0U))
  ;
  local_8260.super_TPZMaterialData.super_TPZShapeData._0_8_ = &PTR__TPZMaterialDataT_018e86d8;
  TPZManVector<TPZManVector<double,_10>,_20>::~TPZManVector
            ((TPZManVector<TPZManVector<double,_10>,_20> *)((long)&local_8260 + 0x7950));
  TPZManVector<TPZManVector<double,_10>,_20>::~TPZManVector
            ((TPZManVector<TPZManVector<double,_10>,_20> *)((long)&local_8260 + 0x7070));
  TPZManVector<TPZFNMatrix<30,_double>,_20>::~TPZManVector
            ((TPZManVector<TPZFNMatrix<30,_double>,_20> *)((long)&local_8260 + 0x51b0U));
  TPZManVector<TPZManVector<double,_10>,_20>::~TPZManVector
            ((TPZManVector<TPZManVector<double,_10>,_20> *)((long)&local_8260 + 0x48d0U));
  TPZMaterialData::~TPZMaterialData(&local_8260.super_TPZMaterialData,&PTR_PTR_018e8740);
  newRows = (data->sol).super_TPZVec<TPZManVector<double,_10>_>.fNElements;
  uVar1 = (((data->sol).super_TPZVec<TPZManVector<double,_10>_>.fStore)->super_TPZVec<double>).
          fNElements;
  uVar2 = (data->super_TPZMaterialData).axes.super_TPZFMatrix<double>.super_TPZMatrix<double>.
          super_TPZBaseMatrix.fRow;
  iVar4 = (int)uVar1;
  TPZFMatrix<double>::Resize
            (&(data->super_TPZMaterialData).phi.super_TPZFMatrix<double>,newRows,(long)iVar4);
  TPZFMatrix<double>::Resize
            (&(data->super_TPZMaterialData).dphix.super_TPZFMatrix<double>,
             (long)(iVar4 * (int)uVar2),newRows);
  if (0 < newRows) {
    local_8290 = 0;
    local_82c0 = 0;
    do {
      if (0 < iVar4) {
        lVar6 = 0;
        local_82b8 = 0;
        uVar8 = 0;
        do {
          if (((data->super_TPZMaterialData).phi.super_TPZFMatrix<double>.super_TPZMatrix<double>.
               super_TPZBaseMatrix.fRow <= local_82c0) ||
             ((data->super_TPZMaterialData).phi.super_TPZFMatrix<double>.super_TPZMatrix<double>.
              super_TPZBaseMatrix.fCol <= (long)uVar8)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          (data->super_TPZMaterialData).phi.super_TPZFMatrix<double>.fElem
          [(data->super_TPZMaterialData).phi.super_TPZFMatrix<double>.super_TPZMatrix<double>.
           super_TPZBaseMatrix.fRow * uVar8 + local_82c0] =
               (data->sol).super_TPZVec<TPZManVector<double,_10>_>.fStore[local_82c0].
               super_TPZVec<double>.fStore[uVar8];
          if (0 < (int)uVar2) {
            uVar5 = 0;
            lVar7 = local_82b8;
            do {
              pTVar3 = (data->dsol).super_TPZVec<TPZFNMatrix<30,_double>_>.fStore;
              if ((pTVar3[local_82c0].super_TPZFMatrix<double>.super_TPZMatrix<double>.
                   super_TPZBaseMatrix.fRow <= (long)uVar5) ||
                 (pTVar3[local_82c0].super_TPZFMatrix<double>.super_TPZMatrix<double>.
                  super_TPZBaseMatrix.fCol <= (long)uVar8)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if (((data->super_TPZMaterialData).dphix.super_TPZFMatrix<double>.
                   super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar7) ||
                 ((data->super_TPZMaterialData).dphix.super_TPZFMatrix<double>.
                  super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= local_82c0)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              *(undefined8 *)
               ((long)(data->super_TPZMaterialData).dphix.super_TPZFMatrix<double>.fElem +
               lVar7 * 8 +
               (data->super_TPZMaterialData).dphix.super_TPZFMatrix<double>.super_TPZMatrix<double>.
               super_TPZBaseMatrix.fRow * local_8290) =
                   *(undefined8 *)
                    ((long)pTVar3[local_82c0].super_TPZFMatrix<double>.fElem +
                    uVar5 * 8 +
                    pTVar3[local_82c0].super_TPZFMatrix<double>.super_TPZMatrix<double>.
                    super_TPZBaseMatrix.fRow * lVar6);
              uVar5 = uVar5 + 1;
              lVar7 = lVar7 + 1;
            } while ((uVar2 & 0x7fffffff) != uVar5);
          }
          uVar8 = uVar8 + 1;
          local_82b8 = local_82b8 + (uVar2 & 0xffffffff);
          lVar6 = lVar6 + 8;
        } while (uVar8 != (uVar1 & 0x7fffffff));
      }
      local_82c0 = local_82c0 + 1;
      local_8290 = local_8290 + 8;
    } while (local_82c0 != newRows);
  }
  return;
}

Assistant:

void TPZReducedSpace::ShapeX(TPZVec<REAL> &qsi,TPZMaterialDataT<STATE> &data)
{
    TPZInterpolationSpace *intel = ReferredIntel();

    {
        TPZMaterialDataT<STATE> inteldata;
        inteldata.fNeedsSol=true;
        constexpr bool hasPhi{false};
        intel->ComputeSolution(qsi,inteldata,hasPhi);
        data.sol = std::move(inteldata.sol);
        data.dsol = std::move(inteldata.dsol);
    }
    int64_t nsol = data.sol.size();
    int nstate = data.sol[0].size();
    int dim = data.axes.Rows();
    data.phi.Resize(nsol,nstate);
    data.dphix.Resize(nstate*dim,nsol);
    for (int64_t isol =0; isol<nsol; isol++) {
        for (int istate=0; istate<nstate; istate++) {
            data.phi(isol,istate) = data.sol[isol][istate];
            for (int id=0; id<dim; id++) {
                data.dphix(id+istate*dim,isol) = data.dsol[isol](id,istate);
            }
        }
    }
}